

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPrism> *this,void **vtt,TPZGeoBlend<pzgeom::TPZGeoPrism> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  TPZGeoEl **ppTVar8;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  iVar1 = (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1];
  iVar3 = (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2];
  iVar4 = (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3];
  iVar5 = (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4];
  iVar6 = (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5];
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0] =
       (cp->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0];
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2] = iVar3;
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3] = iVar4;
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4] = iVar5;
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5] = iVar6;
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  lVar7 = 0x50;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar7 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar7 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar7 + -0x10) = 0xffffffffffffffff;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x1d0);
  this_00 = (TPZTransform<double> *)&this->field_0x1c0;
  lVar7 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar7));
    lVar7 = lVar7 + 0x1a0;
  } while (lVar7 != 0x1a00);
  iVar1 = cp->fGeoEl->fIndex;
  t = (TPZTransform<double> *)&cp->field_0x1c0;
  lVar7 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar7) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar7);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar7) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar7);
    TPZTransform<double>::operator=(this_00,t);
    lVar7 = lVar7 + 0x18;
    t = t + 1;
    this_00 = this_00 + 1;
  } while (lVar7 != 0x180);
  ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(destmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,iVar1);
  pTVar2 = *ppTVar8;
  this->fGeoEl = pTVar2;
  if (pTVar2 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}